

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcFace>(DB *db,LIST *params,IfcFace *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_f8;
  TypeError *t;
  reference local_80;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator<char> local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcFace *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcFace *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcTopologicalRepresentationItem>
                       (db,params,&in->super_IfcTopologicalRepresentationItem);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 != 0) {
    local_28 = local_28 + 1;
    EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
    peVar2 = std::
             __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_70);
    if (peVar2 == (element_type *)0x0) {
      local_f8 = 0;
    }
    else {
      local_f8 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::ISDERIVED::typeinfo,0)
      ;
    }
    if (local_f8 == 0) {
      GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,1ul,0ul>
                ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcFaceBound>,_1UL,_0UL> *)
                 (base + 0x30),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,
                 (DB *)params_local);
    }
    else {
      std::bitset<1UL>::operator[]((bitset<1UL> *)&local_80,base + 0x28);
      std::bitset<1UL>::reference::operator=(&local_80,true);
      std::bitset<1UL>::reference::~reference(&local_80);
    }
    std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
              ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
    return local_28;
  }
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 1;
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"expected 1 arguments to IfcFace",&local_49);
  TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
  arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._3_1_ = 0;
  __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
}

Assistant:

size_t GenericFill<IfcFace>(const DB& db, const LIST& params, IfcFace* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcTopologicalRepresentationItem*>(in));
	if (params.GetSize() < 1) { throw STEP::TypeError("expected 1 arguments to IfcFace"); }    do { // convert the 'Bounds' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const ISDERIVED*>(&*arg)) { in->ObjectHelper<Assimp::IFC::Schema_2x3::IfcFace,1>::aux_is_derived[0]=true; break; }
        try { GenericConvert( in->Bounds, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcFace to be a `SET [1:?] OF IfcFaceBound`")); }
    } while(0);
	return base;
}